

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

mpack_tag_t mpack_node_tag(mpack_node_t node)

{
  mpack_tag_t mVar1;
  
  if ((node.tree)->error != mpack_ok) {
    return (mpack_tag_t)(ZEXT816(1) << 0x40);
  }
  mVar1 = (mpack_tag_t)
          (*(code *)(&DAT_0010c894 +
                    *(int *)(&DAT_0010c894 + (ulong)((node.data)->type - mpack_type_nil) * 4)))();
  return mVar1;
}

Assistant:

mpack_tag_t mpack_node_tag(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return mpack_tag_nil();

    mpack_tag_t tag = MPACK_TAG_ZERO;

    tag.type = node.data->type;
    switch (node.data->type) {
        case mpack_type_nil:                                            break;
        case mpack_type_bool:    tag.v.b = node.data->value.b;          break;
        case mpack_type_float:   tag.v.f = node.data->value.f;          break;
        case mpack_type_double:  tag.v.d = node.data->value.d;          break;
        case mpack_type_int:     tag.v.i = node.data->value.i;          break;
        case mpack_type_uint:    tag.v.u = node.data->value.u;          break;

        case mpack_type_str:     tag.v.l = node.data->len;     break;
        case mpack_type_bin:     tag.v.l = node.data->len;     break;

        case mpack_type_ext:
            tag.v.ext.length = node.data->len;
            tag.v.ext.exttype = mpack_node_exttype_unchecked(node);
            break;

        case mpack_type_array:   tag.v.n = node.data->len;  break;
        case mpack_type_map:     tag.v.n = node.data->len;  break;

        default:
            mpack_assert(0, "unrecognized type %i", (int)node.data->type);
            break;
    }
    return tag;
}